

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::adjust_pressure(Renderer *this,int chan,int note,int amount)

{
  Voice *pVVar1;
  long lVar2;
  long lVar3;
  bool bVar5;
  long lVar4;
  
  lVar2 = (long)this->voices;
  lVar3 = lVar2 * 0x170;
  do {
    do {
      lVar4 = lVar3;
      lVar3 = lVar4 + -0x170;
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + -1;
      if (bVar5) {
        return;
      }
      pVVar1 = this->voice;
    } while (((((&pVVar1[-1].status)[lVar4] & 1) == 0) ||
             ((uint)(&pVVar1[-1].channel)[lVar4] != chan)) ||
            ((uint)(&pVVar1[-1].note)[lVar4] != note));
    (&pVVar1[-1].velocity)[lVar4] = (BYTE)amount;
    recompute_amp(this,(Voice *)(&pVVar1[-1].status + lVar4));
    apply_envelope_to_amp((Voice *)(&this->voice[-1].status + lVar4));
  } while (*(char *)(*(long *)((long)&this->voice[-1].sample + lVar4) + 0x50) == '\x01');
  return;
}

Assistant:

void Renderer::adjust_pressure(int chan, int note, int amount)
{
	int i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RUNNING) &&
			voice[i].channel == chan &&
			voice[i].note == note)
		{
			voice[i].velocity = amount;
			recompute_amp(&voice[i]);
			apply_envelope_to_amp(&voice[i]);
			if (!(voice[i].sample->self_nonexclusive))
			{
				return;
			}
		}
	}
}